

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O3

void KYBER_generate_key_external_entropy
               (uint8_t *out_encoded_public_key,KYBER_private_key *out_private_key,uint8_t *entropy)

{
  matrix *out;
  scalar *a;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint16_t uVar4;
  int iVar5;
  int i;
  long lVar6;
  long lVar7;
  scalar *out_00;
  int j;
  long lVar8;
  scalar *out_01;
  KYBER_private_key *pKVar9;
  uint8_t hashed [64];
  CBB cbb;
  vector error;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  CBB *local_858;
  undefined8 uStack_850;
  uint8_t *local_848;
  size_t sStack_840;
  undefined1 local_838 [512];
  undefined1 local_638 [24];
  size_t sStack_620;
  undefined1 local_618;
  
  BORINGSSL_keccak((uint8_t *)&local_878,0x40,entropy,0x20,boringssl_sha3_512);
  *(undefined8 *)((long)&out_private_key->opaque + 0x610) = local_868;
  *(undefined8 *)((long)&out_private_key->opaque + 0x618) = uStack_860;
  *(undefined8 *)((long)&out_private_key->opaque + 0x600) = local_878;
  *(undefined8 *)((long)&out_private_key->opaque + 0x608) = uStack_870;
  out = (matrix *)((long)&out_private_key->opaque + 0x640);
  matrix_expand(out,(uint8_t *)&local_878);
  a = (scalar *)((long)&out_private_key->opaque + 0x1840);
  out_00 = (scalar *)local_638;
  local_638._16_8_ = local_848;
  sStack_620 = sStack_840;
  local_638._0_8_ = local_858;
  local_638._8_8_ = uStack_850;
  lVar6 = 0;
  out_01 = a;
  do {
    lVar8 = lVar6 + 1;
    local_618 = (undefined1)lVar6;
    scalar_centered_binomial_distribution_eta_2_with_prf(out_01,(uint8_t *)out_00);
    out_01 = out_01 + 1;
    lVar6 = lVar8;
  } while (lVar8 != 3);
  vector_ntt((vector *)a);
  local_838._16_8_ = local_848;
  local_838._24_8_ = sStack_840;
  local_838._0_8_ = local_858;
  local_838._8_8_ = uStack_850;
  lVar6 = -3;
  do {
    local_838[0x20] = (char)lVar6 + '\x06';
    scalar_centered_binomial_distribution_eta_2_with_prf(out_00,local_838);
    out_00 = out_00 + 1;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0);
  vector_ntt((vector *)local_638);
  lVar6 = 0;
  memset(out_private_key,0,0x600);
  pKVar9 = out_private_key;
  do {
    lVar8 = 0;
    do {
      scalar_mult((scalar *)local_838,out->v[lVar8] + lVar6,a + lVar8);
      lVar7 = 0;
      do {
        uVar4 = reduce_once(*(short *)(local_838 + lVar7 * 2) +
                            *(short *)((long)&pKVar9->opaque + lVar7 * 2));
        *(uint16_t *)((long)&pKVar9->opaque + lVar7 * 2) = uVar4;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x100);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    lVar6 = lVar6 + 1;
    pKVar9 = (KYBER_private_key *)((long)&pKVar9->opaque + 0x200);
  } while (lVar6 != 3);
  vector_add((vector *)out_private_key,(vector *)local_638);
  CBB_init_fixed((CBB *)local_838,out_encoded_public_key,0x4a0);
  iVar5 = kyber_marshal_public_key((CBB *)local_838,(public_key *)out_private_key);
  if (iVar5 != 0) {
    BORINGSSL_keccak((out_private_key->opaque).bytes + 0x620,0x20,out_encoded_public_key,0x4a0,
                     boringssl_sha3_256);
    uVar1 = *(undefined8 *)(entropy + 0x20);
    uVar2 = *(undefined8 *)(entropy + 0x28);
    uVar3 = *(undefined8 *)(entropy + 0x38);
    *(undefined8 *)((long)&out_private_key->opaque + 0x1e50) = *(undefined8 *)(entropy + 0x30);
    *(undefined8 *)((long)&out_private_key->opaque + 0x1e58) = uVar3;
    *(undefined8 *)((long)&out_private_key->opaque + 0x1e40) = uVar1;
    *(undefined8 *)((long)&out_private_key->opaque + 0x1e48) = uVar2;
    return;
  }
  abort();
}

Assistant:

void KYBER_generate_key_external_entropy(
    uint8_t out_encoded_public_key[KYBER_PUBLIC_KEY_BYTES],
    struct KYBER_private_key *out_private_key,
    const uint8_t entropy[KYBER_GENERATE_KEY_ENTROPY]) {
  struct private_key *priv = private_key_from_external(out_private_key);
  uint8_t hashed[64];
  hash_g(hashed, entropy, 32);
  const uint8_t *const rho = hashed;
  const uint8_t *const sigma = hashed + 32;
  // rho is public.
  CONSTTIME_DECLASSIFY(rho, 32);
  OPENSSL_memcpy(priv->pub.rho, hashed, sizeof(priv->pub.rho));
  matrix_expand(&priv->pub.m, rho);
  uint8_t counter = 0;
  vector_generate_secret_eta_2(&priv->s, &counter, sigma);
  vector_ntt(&priv->s);
  vector error;
  vector_generate_secret_eta_2(&error, &counter, sigma);
  vector_ntt(&error);
  matrix_mult_transpose(&priv->pub.t, &priv->pub.m, &priv->s);
  vector_add(&priv->pub.t, &error);
  // t is part of the public key and thus is public.
  CONSTTIME_DECLASSIFY(&priv->pub.t, sizeof(priv->pub.t));

  CBB cbb;
  CBB_init_fixed(&cbb, out_encoded_public_key, KYBER_PUBLIC_KEY_BYTES);
  if (!kyber_marshal_public_key(&cbb, &priv->pub)) {
    abort();
  }

  hash_h(priv->pub.public_key_hash, out_encoded_public_key,
         KYBER_PUBLIC_KEY_BYTES);
  OPENSSL_memcpy(priv->fo_failure_secret, entropy + 32, 32);
}